

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O2

void __thiscall
ParticleArrayTest_Back_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>_>::TestBody
          (ParticleArrayTest_Back_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>_>
           *this)

{
  Particle<(pica::Dimension)2> particle_00;
  Particle<(pica::Dimension)2> a;
  Particle<(pica::Dimension)2> a_00;
  ParticleRef b;
  int iVar1;
  int iVar2;
  bool bVar3;
  ConstParticleRef b_00;
  AssertHelper local_240;
  AssertionResult gtest_ar__1;
  String local_228;
  AssertHelper local_218;
  ParticleType particle;
  undefined4 uStack_1c4;
  undefined4 uStack_1b4;
  ParticleArray particlesCopy;
  ParticleArray particles;
  
  memset(&particles,0,0xc0);
  iVar2 = 0xd;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>::randomParticle
              (&particle,(BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> *)this);
    particle_00.position.y = particle.position.y;
    particle_00.position.x = particle.position.x;
    particle_00.p.x = particle.p.x;
    particle_00.p.y = particle.p.y;
    particle_00.p.z = particle.p.z;
    particle_00.factor = particle.factor;
    particle_00.invGamma = particle.invGamma;
    particle_00.typeIndex = particle.typeIndex;
    particle_00._58_6_ = particle._58_6_;
    pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>>::
    pushBack<pica::Particle<(pica::Dimension)2>>
              ((ParticleArraySoA<pica::Particle<(pica::Dimension)2>> *)&particles,particle_00);
    iVar1 = (int)((ulong)((long)particles.typeIndex.
                                super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)particles.typeIndex.super__Vector_base<short,_std::allocator<short>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 1) + -1;
    b.super_ConstParticleRef._12_4_ = uStack_1c4;
    b.super_ConstParticleRef.idx = iVar1;
    b._28_4_ = uStack_1b4;
    b.idx = iVar1;
    a.position.y = particle.position.y;
    a.position.x = particle.position.x;
    a.p.x = particle.p.x;
    a.p.y = particle.p.y;
    a.p.z = particle.p.z;
    a.factor = particle.factor;
    a.invGamma = particle.invGamma;
    a.typeIndex = particle.typeIndex;
    a._58_6_ = particle._58_6_;
    b.super_ConstParticleRef.particles = &particles;
    b.particles = &particles;
    particlesCopy.positions[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ =
         BaseParticleFixture<pica::Particle<(pica::Dimension)2>>::
         eqParticles_<pica::Particle<(pica::Dimension)2>,pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>>::ParticleRef>
                   ((BaseParticleFixture<pica::Particle<(pica::Dimension)2>> *)this,a,b);
    particlesCopy.positions[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (!(bool)particlesCopy.positions[0].super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start._0_1_) {
      testing::Message::Message((Message *)&local_228);
      testing::internal::GetBoolAssertionFailureMessage
                ((internal *)&gtest_ar__1,(AssertionResult *)&particlesCopy,
                 "this->eqParticles_(particle, particles.back())","false","true");
      testing::internal::AssertHelper::AssertHelper
                (&local_240,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
                 ,0x67,(char *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_));
      testing::internal::AssertHelper::operator=(&local_240,(Message *)&local_228);
      testing::internal::AssertHelper::~AssertHelper(&local_240);
      testing::internal::String::~String((String *)&gtest_ar__1);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_228);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&particlesCopy.positions[0].super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_finish);
    pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::ParticleArraySoA
              (&particlesCopy,&particles);
    b_00.idx = (int)((ulong)((long)particlesCopy.typeIndex.
                                   super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)particlesCopy.typeIndex.
                                  super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 1) + -1;
    a_00.position.y = particle.position.y;
    a_00.position.x = particle.position.x;
    a_00.p.x = particle.p.x;
    a_00.p.y = particle.p.y;
    a_00.p.z = particle.p.z;
    a_00.factor = particle.factor;
    a_00.invGamma = particle.invGamma;
    a_00.typeIndex = particle.typeIndex;
    a_00._58_6_ = particle._58_6_;
    b_00.particles = &particlesCopy;
    b_00._12_4_ = 0;
    gtest_ar__1.success_ =
         BaseParticleFixture<pica::Particle<(pica::Dimension)2>>::
         eqParticles_<pica::Particle<(pica::Dimension)2>,pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>>::ConstParticleRef>
                   ((BaseParticleFixture<pica::Particle<(pica::Dimension)2>> *)this,a_00,b_00);
    gtest_ar__1.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!gtest_ar__1.success_) {
      testing::Message::Message((Message *)&local_240);
      testing::internal::GetBoolAssertionFailureMessage
                ((internal *)&local_228,&gtest_ar__1,
                 "this->eqParticles_(particle, particlesCopy.back())","false","true");
      testing::internal::AssertHelper::AssertHelper
                (&local_218,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
                 ,0x69,local_228.c_str_);
      testing::internal::AssertHelper::operator=(&local_218,(Message *)&local_240);
      testing::internal::AssertHelper::~AssertHelper(&local_218);
      testing::internal::String::~String(&local_228);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_240);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar__1.message_);
    pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::~ParticleArraySoA(&particlesCopy);
  }
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::~ParticleArraySoA(&particles);
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, Back)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;
    typedef typename ParticleArrayTest<TypeParam>::Particle ParticleType;

    ParticleArray particles;
    for (int i = 0; i < 13; i++) {
        ParticleType particle = this->randomParticle();
        particles.pushBack(particle);
        EXPECT_TRUE(this->eqParticles_(particle, particles.back()));
        const ParticleArray particlesCopy = particles;
        EXPECT_TRUE(this->eqParticles_(particle, particlesCopy.back()));
    }
}